

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

__ssize_t __thiscall
httplib::detail::stream_line_reader::getline
          (stream_line_reader *this,char **__lineptr,size_t *__n,FILE *__stream)

{
  int iVar1;
  undefined4 extraout_var;
  char local_21;
  int n;
  char byte;
  size_t i;
  stream_line_reader *this_local;
  ulong uVar2;
  
  this->fixed_buffer_used_size_ = 0;
  i = (size_t)this;
  std::__cxx11::string::clear();
  _n = 0;
  do {
    iVar1 = (*this->strm_->_vptr_Stream[2])(this->strm_,&local_21,1);
    uVar2 = CONCAT44(extraout_var,iVar1);
    if (iVar1 < 0) {
      this_local._7_1_ = 0;
LAB_00221a75:
      return CONCAT71((int7)(uVar2 >> 8),this_local._7_1_);
    }
    if (iVar1 == 0) {
      if (_n == 0) {
        this_local._7_1_ = 0;
      }
      else {
LAB_00221a71:
        this_local._7_1_ = 1;
      }
      goto LAB_00221a75;
    }
    append(this,local_21);
    uVar2 = (ulong)(uint)(int)local_21;
    if ((int)local_21 == 10) goto LAB_00221a71;
    _n = _n + 1;
  } while( true );
}

Assistant:

bool getline() {
    fixed_buffer_used_size_ = 0;
    glowable_buffer_.clear();

    for (size_t i = 0;; i++) {
      char byte;
      auto n = strm_.read(&byte, 1);

      if (n < 0) {
        return false;
      } else if (n == 0) {
        if (i == 0) {
          return false;
        } else {
          break;
        }
      }

      append(byte);

      if (byte == '\n') { break; }
    }

    return true;
  }